

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImDrawList *draw_list;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  char *pcVar9;
  bool bVar10;
  ImS8 IVar11;
  ImU32 id;
  ImU32 col;
  ImGuiID close_button_id;
  size_t sVar12;
  undefined8 extraout_RAX;
  char *pcVar13;
  ImGuiTabItem *pIVar14;
  uint uVar15;
  ImGuiCol idx;
  int iVar16;
  uint uVar17;
  bool is_contents_visible;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar19;
  bool text_clipped;
  bool just_closed;
  ImGuiContext *local_d0;
  uint local_c4;
  ImVec2 local_c0;
  ImGuiWindow *local_b8;
  uint local_ac;
  undefined1 local_a8 [4];
  undefined1 auStack_a4 [12];
  ImGuiTabItem *local_90;
  bool *local_88;
  bool hovered;
  undefined7 uStack_7f;
  float fStack_7c;
  bool held;
  float local_74;
  ImGuiTabItem *local_70;
  char *local_68;
  int local_5c;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar8 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_d0 = pIVar8;
  local_88 = (bool *)0x0;
  uVar15 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_88 = p_open;
    uVar15 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar15 = flags;
  }
  local_b8 = pIVar6;
  IVar19 = TabItemCalcSize(label,local_88 != (bool *)0x0);
  auStack_a4._4_4_ = extraout_XMM0_Dc;
  local_a8 = (undefined1  [4])IVar19.x;
  auStack_a4._0_4_ = IVar19.y;
  auStack_a4._8_4_ = extraout_XMM0_Dd;
  local_90 = TabBarFindTabByID(tab_bar,id);
  local_70 = local_90;
  local_68 = label;
  if (local_90 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar14 = (tab_bar->Tabs).Data;
    iVar4 = (tab_bar->Tabs).Size;
    local_90 = pIVar14 + (long)iVar4 + -1;
    local_90->ID = id;
    pIVar14[(long)iVar4 + -1].Width = (float)local_a8;
    tab_bar->TabsAddedNew = true;
  }
  else {
    pIVar14 = (tab_bar->Tabs).Data;
  }
  pcVar9 = local_68;
  tab_bar->LastTabItemIdx = (ImS16)(((long)local_90 - (long)pIVar14) / 0x24);
  local_90->ContentWidth = (float)local_a8;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  uVar17 = uVar15 | 0x100000;
  if (local_88 != (bool *)0x0) {
    uVar17 = uVar15;
  }
  local_90->BeginOrder = sVar3;
  local_ac = tab_bar->Flags;
  local_c0.x = (float)(tab_bar->PrevFrameVisible + 1);
  iVar4 = local_d0->FrameCount;
  iVar16 = local_90->LastFrameVisible + 1;
  local_90->LastFrameVisible = iVar4;
  local_90->Flags = uVar17;
  iVar5 = (tab_bar->TabsNames).Buf.Size;
  sVar3 = (short)iVar5 + -1;
  if (iVar5 == 0) {
    sVar3 = 0;
  }
  local_90->NameOffset = sVar3;
  sVar12 = strlen(local_68);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar9,pcVar9 + sVar12 + 1);
  if (((iVar16 < iVar4) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_c0.x < iVar4) {
      if ((uVar17 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0014526b;
    }
    else if ((uVar17 >> 0x15 & 1) == 0) {
LAB_0014526b:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar17 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar17 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_c0.x < iVar4) && ((tab_bar->Tabs).Size == 1))
  {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((iVar16 < iVar4) && (local_70 == (ImGuiTabItem *)0x0 || iVar4 <= (int)local_c0.x)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar17 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    local_90->LastFrameSelected = local_d0->FrameCount;
  }
  uVar15 = local_90->Flags;
  fVar2 = local_90->Width;
  fVar18 = local_90->Offset;
  if ((uVar15 & 0xc0) == 0) {
    fVar18 = (float)(int)(fVar18 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar18 + (tab_bar->BarRect).Min.x;
  local_c0 = (local_b8->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar19.y = bb.Min.y;
  IVar19.x = bb.Min.x;
  (local_b8->DC).CursorPos = IVar19;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_a4._0_4_ + bb.Min.y;
  local_c4 = uVar17;
  local_5c = iVar4;
  if ((uVar15 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001453ce;
    fStack_7c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_74 = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_a8 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001453ce:
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_a4;
    _local_a8 = auVar7 << 0x20;
  }
  pIVar6 = local_b8;
  pIVar8 = local_d0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_7c = bb.Max.y - bb.Min.y;
  IVar19 = (local_b8->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_d0->Style).FramePadding.y);
  (pIVar6->DC).CursorMaxPos = IVar19;
  bVar10 = ItemAdd(&bb,id,(ImRect *)0x0);
  uVar15 = local_c4;
  if (!bVar10) {
    if (local_a8[0] != '\0') {
      PopClipRect();
    }
    (local_b8->DC).CursorPos = local_c0;
    return is_contents_visible;
  }
  uVar17 = local_c4 & 0x200000;
  bVar10 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar17 >> 0x11) + (uint)pIVar8->DragDropActive * 0x200 + 0x1010);
  local_70 = (ImGuiTabItem *)CONCAT71(local_70._1_7_,bVar10);
  if ((bVar10) && (uVar17 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | local_d0->HoveredId == id);
  if (local_d0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if ((((held == true) && (local_5c <= iVar16)) && (bVar10 = IsMouseDragging(0,-1.0), bVar10)) &&
     ((local_d0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar2 = (local_d0->IO).MouseDelta.x;
    if (fVar2 < 0.0) {
      IVar11 = -1;
      pIVar1 = &(local_d0->IO).MousePos;
      if (bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x) goto LAB_00145509;
LAB_00145527:
      tab_bar->ReorderRequestTabId = local_90->ID;
      tab_bar->ReorderRequestDir = IVar11;
    }
    else {
LAB_00145509:
      if (0.0 < fVar2) {
        IVar11 = '\x01';
        if (bb.Max.x < (local_d0->IO).MousePos.x) goto LAB_00145527;
      }
    }
  }
  draw_list = local_b8->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_ac >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_ac >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,uVar15,col);
  RenderNavHighlight(&bb,id,1);
  bVar10 = IsItemHovered(8);
  if (bVar10) {
    bVar10 = IsMouseClicked(1,false);
    if (bVar10) {
      uVar17 = uVar15 >> 0x15 & 1;
    }
    else {
      bVar10 = IsMouseReleased(1);
      if (!bVar10) goto LAB_00145675;
    }
    if (uVar17 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00145675:
  auVar7 = _local_a8;
  uVar17 = tab_bar->Flags;
  if (local_88 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar17 >> 1 & 4 | uVar15,tab_bar->FramePadding,local_68,id,
             close_button_id,is_contents_visible,&just_closed,&text_clipped);
  if ((local_88 != (bool *)0x0) && (just_closed != false)) {
    *local_88 = false;
    TabBarCloseTab(tab_bar,local_90);
  }
  pIVar8 = local_d0;
  if (auVar7[0] != '\0') {
    PopClipRect();
  }
  uVar15 = local_c4;
  (local_b8->DC).CursorPos = local_c0;
  if ((((text_clipped == true) && (pIVar8->HoveredId == id)) && (held == false)) &&
     (((pIVar8->TooltipSlowDelay <= pIVar8->HoveredIdNotActiveTimer &&
        pIVar8->HoveredIdNotActiveTimer != pIVar8->TooltipSlowDelay &&
       (bVar10 = IsItemHovered(0), pcVar9 = local_68, bVar10)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_90->Flags & 0x10) == 0)))))) {
    pcVar13 = FindRenderedTextEnd(local_68,(char *)0x0);
    uVar15 = local_c4;
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)pcVar9),pcVar9);
  }
  if ((uVar15 >> 0x15 & 1) == 0) {
    local_70._0_1_ = is_contents_visible;
  }
  return (bool)local_70._0_1_;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}